

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btCollisionWorld::btCollisionWorld
          (btCollisionWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btCollisionConfiguration *collisionConfiguration)

{
  this->_vptr_btCollisionWorld = (_func_int **)&PTR__btCollisionWorld_001ec9e0;
  (this->m_collisionObjects).m_ownsMemory = true;
  (this->m_collisionObjects).m_data = (btCollisionObject **)0x0;
  (this->m_collisionObjects).m_size = 0;
  (this->m_collisionObjects).m_capacity = 0;
  this->m_dispatcher1 = dispatcher;
  btDispatcherInfo::btDispatcherInfo(&this->m_dispatchInfo);
  this->m_broadphasePairCache = pairCache;
  this->m_debugDrawer = (btIDebugDraw *)0x0;
  this->m_forceUpdateAllAabbs = true;
  return;
}

Assistant:

btCollisionWorld::btCollisionWorld(btDispatcher* dispatcher,btBroadphaseInterface* pairCache, btCollisionConfiguration* collisionConfiguration)
:m_dispatcher1(dispatcher),
m_broadphasePairCache(pairCache),
m_debugDrawer(0),
m_forceUpdateAllAabbs(true)
{
}